

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::destroy_node(xml_node_struct *n,xml_allocator *alloc)

{
  xml_node_struct *in_RSI;
  ulong *in_RDI;
  xml_allocator *unaff_retaddr;
  xml_node_struct *next_1;
  xml_node_struct *child;
  xml_attribute_struct *next;
  xml_attribute_struct *attr;
  xml_memory_page *in_stack_ffffffffffffffc8;
  xml_attribute_struct *in_stack_ffffffffffffffd0;
  xml_attribute_struct *pxVar1;
  xml_memory_page *in_stack_ffffffffffffffe0;
  xml_memory_page *pxVar2;
  xml_allocator *alloc_00;
  
  if ((*in_RDI & 0x20) != 0) {
    xml_allocator::deallocate_string(unaff_retaddr,(char_t *)in_RDI);
  }
  if ((*in_RDI & 0x10) != 0) {
    xml_allocator::deallocate_string(unaff_retaddr,(char_t *)in_RDI);
  }
  pxVar2 = (xml_memory_page *)in_RDI[7];
  while (pxVar2 != (xml_memory_page *)0x0) {
    in_stack_ffffffffffffffe0 = ((xml_allocator *)((long)pxVar2 + 0x20))->_root;
    destroy_attribute(in_stack_ffffffffffffffd0,(xml_allocator *)in_stack_ffffffffffffffc8);
    pxVar2 = in_stack_ffffffffffffffe0;
  }
  alloc_00 = (xml_allocator *)0x0;
  pxVar1 = (xml_attribute_struct *)in_RDI[4];
  while (pxVar1 != (xml_attribute_struct *)0x0) {
    in_stack_ffffffffffffffd0 = (xml_attribute_struct *)pxVar1[1].name;
    destroy_node(in_RSI,alloc_00);
    pxVar1 = in_stack_ffffffffffffffd0;
  }
  xml_allocator::deallocate_memory
            ((xml_allocator *)in_stack_ffffffffffffffe0,(void *)0x0,
             (size_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

inline void destroy_node(xml_node_struct* n, xml_allocator& alloc)
	{
		if (n->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(n->name);

		if (n->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(n->value);

		for (xml_attribute_struct* attr = n->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			destroy_attribute(attr, alloc);

			attr = next;
		}

		for (xml_node_struct* child = n->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			destroy_node(child, alloc);

			child = next;
		}

		alloc.deallocate_memory(n, sizeof(xml_node_struct), PUGI_IMPL_GETPAGE(n));
	}